

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void proc_rec_opt(Telnet *telnet,int cmd,int option)

{
  int iVar1;
  Opt **ppOVar2;
  size_t sVar3;
  undefined1 *puVar4;
  int iVar5;
  Opt *o;
  uchar b [3];
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined1 local_2c [3];
  undefined2 local_29;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23 [3];
  
  log_option(telnet,"server",cmd,option);
  o = &o_naws;
  ppOVar2 = opts;
  do {
    ppOVar2 = ppOVar2 + 1;
    local_2d = (undefined1)option;
    if (o->option == option) {
      if (o->ack == cmd) {
        iVar5 = o->index;
        iVar1 = telnet->opt_states[iVar5];
        if (iVar1 != 3) {
          if (iVar1 == 2) {
            telnet->opt_states[iVar5] = 1;
            iVar5 = o->send;
            local_2f = 0xff;
            local_2e = (undefined1)iVar5;
            sVar3 = (*telnet->s->vt->write)(telnet->s,&local_2f,3);
            telnet->bufsize = sVar3;
            log_option(telnet,"client",iVar5,option);
            activate_option(telnet,o);
            return;
          }
          if (iVar1 != 0) {
            return;
          }
          telnet->opt_states[iVar5] = 1;
          activate_option(telnet,o);
          return;
        }
        iVar5 = o->nsend;
        puVar4 = local_2c;
        goto LAB_0013c236;
      }
      if ((o->option == option) && (o->nak == cmd)) {
        iVar5 = o->index;
        if (telnet->opt_states[iVar5] == 1) {
          telnet->opt_states[iVar5] = 2;
          iVar5 = o->nsend;
          local_26 = 0xff;
          local_25 = (undefined1)iVar5;
          local_24 = local_2d;
          sVar3 = (*telnet->s->vt->write)(telnet->s,&local_26,3);
          telnet->bufsize = sVar3;
          log_option(telnet,"client",iVar5,option);
        }
        else {
          if (telnet->opt_states[iVar5] != 0) {
            return;
          }
          telnet->opt_states[iVar5] = 2;
          if (((o->send == 0xfb) && (o->option == 0x27)) && (telnet->opt_states[3] == 2)) {
            local_29 = 0xfbff;
            local_27 = 0x24;
            sVar3 = (*telnet->s->vt->write)(telnet->s,&local_29,3);
            telnet->bufsize = sVar3;
            logeventf(telnet->logctx,"%s negotiation: %s %s","client","WILL","OLD_ENVIRON");
            telnet->opt_states[3] = 0;
          }
        }
        option_side_effects(telnet,o,false);
        return;
      }
    }
    o = *ppOVar2;
  } while (o != (Opt *)0x0);
  if ((cmd == 0xfd) || (cmd == 0xfb)) {
    iVar5 = (uint)(cmd == 0xfb) * 2 + 0xfc;
    puVar4 = local_23;
LAB_0013c236:
    *puVar4 = 0xff;
    puVar4[1] = (char)iVar5;
    puVar4[2] = local_2d;
    sVar3 = (*telnet->s->vt->write)(telnet->s,puVar4,3);
    telnet->bufsize = sVar3;
    log_option(telnet,"client",iVar5,option);
  }
  return;
}

Assistant:

static void proc_rec_opt(Telnet *telnet, int cmd, int option)
{
    const struct Opt *const *o;

    log_option(telnet, "server", cmd, option);
    for (o = opts; *o; o++) {
        if ((*o)->option == option && (*o)->ack == cmd) {
            switch (telnet->opt_states[(*o)->index]) {
              case REQUESTED:
                telnet->opt_states[(*o)->index] = ACTIVE;
                activate_option(telnet, *o);
                break;
              case ACTIVE:
                break;
              case INACTIVE:
                telnet->opt_states[(*o)->index] = ACTIVE;
                send_opt(telnet, (*o)->send, option);
                activate_option(telnet, *o);
                break;
              case REALLY_INACTIVE:
                send_opt(telnet, (*o)->nsend, option);
                break;
            }
            return;
        } else if ((*o)->option == option && (*o)->nak == cmd) {
            switch (telnet->opt_states[(*o)->index]) {
              case REQUESTED:
                telnet->opt_states[(*o)->index] = INACTIVE;
                refused_option(telnet, *o);
                break;
              case ACTIVE:
                telnet->opt_states[(*o)->index] = INACTIVE;
                send_opt(telnet, (*o)->nsend, option);
                option_side_effects(telnet, *o, false);
                break;
              case INACTIVE:
              case REALLY_INACTIVE:
                break;
            }
            return;
        }
    }
    /*
     * If we reach here, the option was one we weren't prepared to
     * cope with. If the request was positive (WILL or DO), we send
     * a negative ack to indicate refusal. If the request was
     * negative (WONT / DONT), we must do nothing.
     */
    if (cmd == WILL || cmd == DO)
        send_opt(telnet, (cmd == WILL ? DONT : WONT), option);
}